

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.h
# Opt level: O3

bool __thiscall
cmWorkerPool::
EmplaceJob<cmQtAutoMocUic::JobMocT,std::shared_ptr<cmQtAutoMocUic::MappingT>const&,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
          (cmWorkerPool *this,shared_ptr<cmQtAutoMocUic::MappingT> *args,
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args_1)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  __uniq_ptr_impl<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_> local_20;
  
  local_20._M_t.
  super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
  super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl =
       (tuple<cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>)operator_new(0x30);
  peVar1 = (args->super___shared_ptr<cmQtAutoMocUic::MappingT,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (args->super___shared_ptr<cmQtAutoMocUic::MappingT,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  pbVar3 = (args_1->_M_t).
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  (args_1->_M_t).
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>
                  .super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
          super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined1 *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
          super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x14) = 0;
  *(element_type **)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
          super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x18) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
          super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x20) = p_Var2;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
          super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x28) = pbVar3;
  *(undefined ***)
   local_20._M_t.
   super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
   super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl = &PTR__JobCompileT_0066db98;
  bVar4 = PushJob(this,(JobHandleT *)&local_20);
  if ((_Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
      super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl != (JobT *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>
                          .super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 8))();
  }
  return bVar4;
}

Assistant:

bool EmplaceJob(Args&&... args)
  {
    return PushJob(cm::make_unique<T>(std::forward<Args>(args)...));
  }